

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::Demangle(char *mangled,char *out,int out_size)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  byte bVar7;
  State local_38;
  
  local_38.out_end = out + out_size;
  local_38.prev_name = (char *)0x0;
  local_38.prev_name_length = -1;
  local_38.nest_level = -1;
  local_38.append = true;
  local_38.overflowed = false;
  if ((*mangled == '_') && (mangled[1] == 'Z')) {
    local_38.mangled_cur = mangled + 2;
    local_38.out_cur = out;
    local_38.out_begin = out;
    bVar4 = ParseEncoding(&local_38);
    if (bVar4) {
      cVar1 = *local_38.mangled_cur;
      bVar7 = 1;
      if (cVar1 == '\0') goto LAB_00117ce6;
      if (cVar1 == '@') {
        MaybeAppend(&local_38,local_38.mangled_cur);
        goto LAB_00117ce6;
      }
      if (cVar1 == '.') {
        lVar5 = 0;
        pcVar6 = local_38.mangled_cur;
        do {
          if (0x19 < (byte)((pcVar6[1] & 0xdfU) + 0xbf)) goto LAB_00117ce4;
          lVar2 = lVar5 + 3;
          pcVar3 = local_38.mangled_cur + lVar5 + 3;
          do {
            pcVar6 = pcVar3;
            lVar5 = lVar2;
            lVar2 = lVar5 + 1;
            pcVar3 = pcVar6 + 1;
          } while ((byte)((local_38.mangled_cur[lVar5 + -1] & 0xdfU) + 0xbf) < 0x1a);
          if ((local_38.mangled_cur[lVar5 + -1] != 0x2e) ||
             (9 < (byte)(local_38.mangled_cur[lVar5] - 0x30U))) goto LAB_00117ce4;
          do {
            cVar1 = pcVar6[1];
            pcVar6 = pcVar6 + 1;
            lVar5 = lVar5 + 1;
          } while ((byte)(cVar1 - 0x30U) < 10);
        } while (cVar1 == '.');
        if (cVar1 == '\0') goto LAB_00117ce6;
      }
    }
  }
LAB_00117ce4:
  bVar7 = 0;
LAB_00117ce6:
  return (bool)((local_38.overflowed ^ 1U) & bVar7);
}

Assistant:

static void InitState(State *state, const char *mangled,
                      char *out, int out_size) {
  state->mangled_cur = mangled;
  state->out_cur = out;
  state->out_begin = out;
  state->out_end = out + out_size;
  state->prev_name  = NULL;
  state->prev_name_length = -1;
  state->nest_level = -1;
  state->append = true;
  state->overflowed = false;
}